

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O2

void __thiscall
re2c::Skeleton::generate_paths_cunit<unsigned_int>(Skeleton *this,FILE *input,FILE *keys)

{
  uint32_t uVar1;
  size_t sVar2;
  Node *pNVar3;
  covers_t cStack_6c;
  string sStack_68;
  path_t pStack_48;
  
  sVar2 = this->sizeof_key;
  if (sVar2 == 1) {
    pNVar3 = this->nodes;
    pStack_48.rule = pNVar3->rule;
    pStack_48.ctx = pNVar3->ctx;
    pStack_48.arcs.
    super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pStack_48.arcs.
    super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pStack_48.arcs.
    super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pStack_48.rule_pos = 0;
    pStack_48.ctx_pos = 0;
    cStack_6c.value = 0;
    Node::cover<unsigned_int,unsigned_char>(pNVar3,&pStack_48,input,keys,&cStack_6c);
    if (cStack_6c.value == 0x40000000) {
      uVar1 = this->line;
      incond(&sStack_68,&this->cond);
      warning((char *)0x0,uVar1,false,"DFA %sis too large: can only generate partial path cover",
              sStack_68._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&sStack_68);
    }
    std::
    _Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ::~_Vector_base((_Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                     *)&pStack_48);
    return;
  }
  if (sVar2 != 2) {
    if (sVar2 != 4) {
      return;
    }
    pNVar3 = this->nodes;
    pStack_48.rule = pNVar3->rule;
    pStack_48.ctx = pNVar3->ctx;
    pStack_48.arcs.
    super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pStack_48.arcs.
    super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pStack_48.arcs.
    super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pStack_48.rule_pos = 0;
    pStack_48.ctx_pos = 0;
    cStack_6c.value = 0;
    Node::cover<unsigned_int,unsigned_int>(pNVar3,&pStack_48,input,keys,&cStack_6c);
    if (cStack_6c.value == 0x40000000) {
      uVar1 = this->line;
      incond(&sStack_68,&this->cond);
      warning((char *)0x0,uVar1,false,"DFA %sis too large: can only generate partial path cover",
              sStack_68._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&sStack_68);
    }
    std::
    _Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ::~_Vector_base((_Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                     *)&pStack_48);
    return;
  }
  pNVar3 = this->nodes;
  pStack_48.rule = pNVar3->rule;
  pStack_48.ctx = pNVar3->ctx;
  pStack_48.arcs.
  super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pStack_48.arcs.
  super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pStack_48.arcs.
  super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pStack_48.rule_pos = 0;
  pStack_48.ctx_pos = 0;
  cStack_6c.value = 0;
  Node::cover<unsigned_int,unsigned_short>(pNVar3,&pStack_48,input,keys,&cStack_6c);
  if (cStack_6c.value == 0x40000000) {
    uVar1 = this->line;
    incond(&sStack_68,&this->cond);
    warning((char *)0x0,uVar1,false,"DFA %sis too large: can only generate partial path cover",
            sStack_68._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&sStack_68);
  }
  std::
  _Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::~_Vector_base((_Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                   *)&pStack_48);
  return;
}

Assistant:

void Skeleton::generate_paths_cunit (FILE * input, FILE * keys)
{
	switch (sizeof_key)
	{
		case 4: generate_paths_cunit_key<cunit_t, uint32_t> (input, keys); break;
		case 2: generate_paths_cunit_key<cunit_t, uint16_t> (input, keys); break;
		case 1: generate_paths_cunit_key<cunit_t, uint8_t> (input, keys);  break;
	}
}